

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

uint implementations::scheme::do_scheme_complete_test(void)

{
  environment *this;
  ostream *poVar1;
  size_t __nbytes;
  cell *exp;
  size_t __nbytes_00;
  cell *exp_00;
  size_t __nbytes_01;
  cell *exp_01;
  size_t __nbytes_02;
  cell *exp_02;
  size_t __nbytes_03;
  cell *exp_03;
  size_t __nbytes_04;
  cell *exp_04;
  size_t __nbytes_05;
  cell *exp_05;
  size_t __nbytes_06;
  cell *exp_06;
  size_t __nbytes_07;
  cell *exp_07;
  size_t __nbytes_08;
  cell *exp_08;
  size_t __nbytes_09;
  cell *exp_09;
  size_t __nbytes_10;
  cell *exp_10;
  size_t __nbytes_11;
  cell *exp_11;
  size_t __nbytes_12;
  cell *exp_12;
  size_t __nbytes_13;
  cell *exp_13;
  size_t __nbytes_14;
  cell *exp_14;
  size_t __nbytes_15;
  cell *exp_15;
  size_t __nbytes_16;
  cell *exp_16;
  size_t __nbytes_17;
  cell *exp_17;
  size_t __nbytes_18;
  cell *exp_18;
  size_t __nbytes_19;
  cell *exp_19;
  size_t __nbytes_20;
  cell *exp_20;
  size_t __nbytes_21;
  cell *exp_21;
  size_t __nbytes_22;
  cell *exp_22;
  size_t __nbytes_23;
  cell *exp_23;
  size_t __nbytes_24;
  cell *exp_24;
  size_t __nbytes_25;
  cell *exp_25;
  size_t __nbytes_26;
  cell *exp_26;
  size_t __nbytes_27;
  cell *exp_27;
  bool bVar2;
  env_p global_env;
  allocator local_32a;
  allocator local_329;
  string local_328 [32];
  string local_308;
  string local_2e8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  cell local_2b8;
  cell local_260;
  env_p local_208;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this = (environment *)operator_new(0x98);
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  environment::environment(this,&local_208);
  std::__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<implementations::scheme::environment,void>
            ((__shared_ptr<implementations::scheme::environment,(__gnu_cxx::_Lock_policy)2> *)
             &local_2c8,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&local_2c8);
  add_globals(local_28._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(quote (testing 1 (2.0) -3.14e159))",&local_329);
  std::__cxx11::string::string(local_328,"(quote (testing 1 (2.0) -3.14e159))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_38);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp);
  test_equal_<std::__cxx11::string,char[28]>
            (&local_2e8,&local_308,(char (*) [28])"(testing 1 (2.0) -3.14e159)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x31e);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(+ 2 2)",&local_329);
  std::__cxx11::string::string(local_328,"(+ 2 2)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_00);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_48);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_00);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,799);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(+ (* 2 100) (* 1 10))",&local_329);
  std::__cxx11::string::string(local_328,"(+ (* 2 100) (* 1 10))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_01);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_58);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_01);
  test_equal_<std::__cxx11::string,char[4]>
            (&local_2e8,&local_308,(char (*) [4])"210",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,800);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(if (> 6 5) (+ 1 1) (+ 2 2))",&local_329);
  std::__cxx11::string::string(local_328,"(if (> 6 5) (+ 1 1) (+ 2 2))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_02);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_68);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_02);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x321);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(if (< 6 5) (+ 1 1) (+ 2 2))",&local_329);
  std::__cxx11::string::string(local_328,"(if (< 6 5) (+ 1 1) (+ 2 2))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_03);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_78);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_03);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x322);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(define x 3)",&local_329);
  std::__cxx11::string::string(local_328,"(define x 3)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_04);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_88);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_04);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x323);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"x",&local_329);
  std::__cxx11::string::string(local_328,"x",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_05);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_98);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_05);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x324);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(+ x x)",&local_329);
  std::__cxx11::string::string(local_328,"(+ x x)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_06);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_a8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_06);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x325);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))",&local_329);
  std::__cxx11::string::string(local_328,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))",&local_32a)
  ;
  read((int)&local_2b8,local_328,__nbytes_07);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_b8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_07);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x326);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"((lambda (x) (+ x x)) 5)",&local_329);
  std::__cxx11::string::string(local_328,"((lambda (x) (+ x x)) 5)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_08);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_c8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_08);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_2e8,&local_308,(char (*) [3])0x1270cb,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x327);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(define twice (lambda (x) (* 2 x)))",&local_329);
  std::__cxx11::string::string(local_328,"(define twice (lambda (x) (* 2 x)))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_09);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_d8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_09);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x328);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(twice 5)",&local_329);
  std::__cxx11::string::string(local_328,"(twice 5)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_10);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_e8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_10);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_2e8,&local_308,(char (*) [3])0x1270cb,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x329);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(define compose (lambda (f g) (lambda (x) (f (g x)))))",
             &local_329);
  std::__cxx11::string::string
            (local_328,"(define compose (lambda (f g) (lambda (x) (f (g x)))))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_11);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_f8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_11);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32a);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"((compose list twice) 5)",&local_329);
  std::__cxx11::string::string(local_328,"((compose list twice) 5)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_12);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_108);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_12);
  test_equal_<std::__cxx11::string,char[5]>
            (&local_2e8,&local_308,(char (*) [5])"(10)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32b);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(define repeat (lambda (f) (compose f f)))",&local_329);
  std::__cxx11::string::string(local_328,"(define repeat (lambda (f) (compose f f)))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_13);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_118,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_118);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_13);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32c);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"((repeat twice) 5)",&local_329);
  std::__cxx11::string::string(local_328,"((repeat twice) 5)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_14);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_128);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_14);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_2e8,&local_308,(char (*) [3])"20",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32d);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"((repeat (repeat twice)) 5)",&local_329);
  std::__cxx11::string::string(local_328,"((repeat (repeat twice)) 5)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_15);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_138);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_15);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_2e8,&local_308,(char (*) [3])"80",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32e);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))",
             &local_329);
  std::__cxx11::string::string
            (local_328,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))",&local_32a)
  ;
  read((int)&local_2b8,local_328,__nbytes_16);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_148,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_148);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_16);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32f);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(fact 3)",&local_329);
  std::__cxx11::string::string(local_328,"(fact 3)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_17);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_158);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_17);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_2e8,&local_308,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x330);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(fact 12)",&local_329);
  std::__cxx11::string::string(local_328,"(fact 12)",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_18);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_168);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_18);
  test_equal_<std::__cxx11::string,char[10]>
            (&local_2e8,&local_308,(char (*) [10])"479001600",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x332);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))",&local_329);
  std::__cxx11::string::string
            (local_328,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_19);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_178,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_178);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_19);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x333);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(list (abs -3) (abs 0) (abs 3))",&local_329);
  std::__cxx11::string::string(local_328,"(list (abs -3) (abs 0) (abs 3))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_20);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_188,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_188);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_20);
  test_equal_<std::__cxx11::string,char[8]>
            (&local_2e8,&local_308,(char (*) [8])"(3 0 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x334);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,&local_329);
  std::__cxx11::string::string
            (local_328,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,&local_32a);
  read((int)&local_2b8,local_328,__nbytes_21);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_198,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_198);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_21);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33b);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e8,"(define zip (combine cons))",&local_329);
  std::__cxx11::string::string(local_328,"(define zip (combine cons))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_22);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1a8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_22);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33c);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(zip (list 1 2 3 4) (list 5 6 7 8))",&local_329);
  std::__cxx11::string::string(local_328,"(zip (list 1 2 3 4) (list 5 6 7 8))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_23);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1b8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_23);
  test_equal_<std::__cxx11::string,char[26]>
            (&local_2e8,&local_308,(char (*) [26])"((1 5) (2 6) (3 7) (4 8))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33d);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,&local_329);
  std::__cxx11::string::string
            (local_328,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,&local_32a);
  read((int)&local_2b8,local_328,__nbytes_24);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1c8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_24);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_2e8,&local_308,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x342);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"(riff-shuffle (list 1 2 3 4 5 6 7 8))",&local_329);
  std::__cxx11::string::string(local_328,"(riff-shuffle (list 1 2 3 4 5 6 7 8))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_25);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1d8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_25);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_2e8,&local_308,(char (*) [18])"(1 5 2 6 3 7 4 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x343);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))",&local_329);
  std::__cxx11::string::string
            (local_328,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))",&local_32a);
  read((int)&local_2b8,local_328,__nbytes_26);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1e8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_26);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_2e8,&local_308,(char (*) [18])"(1 3 5 7 2 4 6 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x344);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string
            ((string *)&local_2e8,
             "(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))",&local_329);
  std::__cxx11::string::string
            (local_328,"(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))",
             &local_32a);
  read((int)&local_2b8,local_328,__nbytes_27);
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,&local_2c8);
  eval(&local_260,&local_2b8,(env_p *)&local_1f8);
  to_string_abi_cxx11_(&local_308,(scheme *)&local_260,exp_27);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_2e8,&local_308,(char (*) [18])"(1 2 3 4 5 6 7 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x345);
  std::__cxx11::string::~string((string *)&local_308);
  cell::~cell(&local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  cell::~cell(&local_2b8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string((string *)&local_2e8);
  poVar1 = std::operator<<((ostream *)&std::cout,"total tests ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", total failures ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  bVar2 = g_fault_count != 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
  return (uint)bVar2;
}

Assistant:

unsigned do_scheme_complete_test() {
	env_p global_env(new environment()); add_globals(global_env);
	// the 29 unit tests for lis.py
	TEST("(quote (testing 1 (2.0) -3.14e159))", "(testing 1 (2.0) -3.14e159)");
	TEST("(+ 2 2)", "4");
	TEST("(+ (* 2 100) (* 1 10))", "210");
	TEST("(if (> 6 5) (+ 1 1) (+ 2 2))", "2");
	TEST("(if (< 6 5) (+ 1 1) (+ 2 2))", "4");
	TEST("(define x 3)", "3");
	TEST("x", "3");
	TEST("(+ x x)", "6");
	TEST("(begin (define x 1) (set! x (+ x 1)) (+ x 1))", "3");
	TEST("((lambda (x) (+ x x)) 5)", "10");
	TEST("(define twice (lambda (x) (* 2 x)))", "<Lambda>");
	TEST("(twice 5)", "10");
	TEST("(define compose (lambda (f g) (lambda (x) (f (g x)))))", "<Lambda>");
	TEST("((compose list twice) 5)", "(10)");
	TEST("(define repeat (lambda (f) (compose f f)))", "<Lambda>");
	TEST("((repeat twice) 5)", "20");
	TEST("((repeat (repeat twice)) 5)", "80");
	TEST("(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))", "<Lambda>");
	TEST("(fact 3)", "6");
	//TEST("(fact 50)", "30414093201713378043612608166064768844377641568960512000000000000");
	TEST("(fact 12)", "479001600"); // no bignums; this is as far as we go with 32 bits
	TEST("(define abs (lambda (n) ((if (> n 0) + -) 0 n)))", "<Lambda>");
	TEST("(list (abs -3) (abs 0) (abs 3))", "(3 0 3)");
	//TEST("(define x (lambda (n) (+ n 1)))", "<Lambda>");
	//TEST("(list (x 4) (x 4) (x 4))", "(5 5 5)");
	TEST("(define combine (lambda (f)"
		"(lambda (x y)"
		"(if (null? x) (quote ())"
		"(f (list (head x) (head y))"
		"((combine f) (tail x) (tail y)))))))", "<Lambda>");
	TEST("(define zip (combine cons))", "<Lambda>");
	TEST("(zip (list 1 2 3 4) (list 5 6 7 8))", "((1 5) (2 6) (3 7) (4 8))");
	TEST("(define riff-shuffle (lambda (deck) (begin"
		"(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))"
		"(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))"
		"(define mid (lambda (seq) (/ (length seq) 2)))"
		"((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))", "<Lambda>");
	TEST("(riff-shuffle (list 1 2 3 4 5 6 7 8))", "(1 5 2 6 3 7 4 8)");
	TEST("((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))", "(1 3 5 7 2 4 6 8)");
	TEST("(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))", "(1 2 3 4 5 6 7 8)");
	std::cout
		<< "total tests " << g_test_count
		<< ", total failures " << g_fault_count
		<< "\n";
	return g_fault_count ? EXIT_FAILURE : EXIT_SUCCESS;
}